

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O1

void __thiscall
Interpreter::Interpreter
          (Interpreter *this,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *lexed_data)

{
  PrintCommand *pPVar1;
  SleepCommand *pSVar2;
  OpenDataServerCommand *pOVar3;
  ConnectCommand *this_00;
  AssignVarCommand *this_01;
  DefineVarCommand *pDVar4;
  long lVar5;
  long *plVar6;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>_>
  __l;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>
  local_180;
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined4 local_138;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined4 local_110;
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined4 local_c0;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined4 local_70;
  long *local_68 [2];
  long local_58 [2];
  undefined4 local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_32;
  allocator_type local_31;
  
  local_40 = &(this->condition_string).field_2;
  *(undefined8 *)((long)&this->while_command + 2) = 0;
  *(undefined8 *)((long)&this->if_command + 2) = 0;
  this->define_var_command = (DefineVarCommand *)0x0;
  this->while_command = (WhileCommand *)0x0;
  this->connect_command = (ConnectCommand *)0x0;
  this->assign_var_command = (AssignVarCommand *)0x0;
  this->sleep_command = (SleepCommand *)0x0;
  this->open_data_server_command = (OpenDataServerCommand *)0x0;
  (this->lexed_data_to_interpret).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->print_command = (PrintCommand *)0x0;
  (this->lexed_data_to_interpret).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lexed_data_to_interpret).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->condition_string)._M_dataplus._M_p = (pointer)local_40;
  (this->condition_string)._M_string_length = 0;
  (this->condition_string).field_2._M_local_buf[0] = '\0';
  (this->condition_vector_string).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->condition_vector_string).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->condition_vector_string).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->while_strings_vectors).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->while_strings_vectors).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->while_strings_vectors).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->while_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->while_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->while_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->if_strings_vectors).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->if_strings_vectors).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->if_strings_vectors).
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->if_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->if_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->if_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180.first._M_dataplus._M_p = (pointer)&local_180.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"openDataServer","");
  local_180.second = OPEN_DATA_SERVER;
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"connectControlClient","");
  local_138 = 1;
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"var","");
  local_110 = 2;
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Print","");
  local_e8 = 3;
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"Sleep","");
  local_c0 = 4;
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"while","");
  local_98 = 6;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"if","");
  local_70 = 7;
  plVar6 = local_58;
  local_68[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"}","");
  local_48 = 8;
  __l._M_len = 8;
  __l._M_array = &local_180;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>_>_>
  ::map(&this->CMD_DICTIONARY,__l,&local_32,&local_31);
  lVar5 = -0x140;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -5;
    lVar5 = lVar5 + 0x28;
  } while (lVar5 != 0);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator=(&this->lexed_data_to_interpret,lexed_data);
  pPVar1 = (PrintCommand *)operator_new(0x28);
  (pPVar1->super_Command)._vptr_Command = (_func_int **)0x0;
  (pPVar1->message)._M_dataplus._M_p = (pointer)0x0;
  (pPVar1->message)._M_string_length = 0;
  (pPVar1->message).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pPVar1->message).field_2 + 8) = 0;
  (pPVar1->super_Command)._vptr_Command = (_func_int **)&PTR_execute_00116888;
  (pPVar1->message)._M_dataplus._M_p = (pointer)&(pPVar1->message).field_2;
  (pPVar1->message)._M_string_length = 0;
  (pPVar1->message).field_2._M_local_buf[0] = '\0';
  this->print_command = pPVar1;
  pSVar2 = (SleepCommand *)operator_new(0x30);
  (pSVar2->super_Command)._vptr_Command = (_func_int **)0x0;
  (pSVar2->time_to_sleep_string)._M_dataplus._M_p = (pointer)0x0;
  (pSVar2->time_to_sleep_string)._M_string_length = 0;
  (pSVar2->time_to_sleep_string).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pSVar2->time_to_sleep_string).field_2 + 8) = 0;
  *(undefined8 *)&pSVar2->milliseconds = 0;
  (pSVar2->super_Command)._vptr_Command = (_func_int **)&PTR_execute_001168d0;
  (pSVar2->time_to_sleep_string)._M_dataplus._M_p = (pointer)&(pSVar2->time_to_sleep_string).field_2
  ;
  (pSVar2->time_to_sleep_string)._M_string_length = 0;
  (pSVar2->time_to_sleep_string).field_2._M_local_buf[0] = '\0';
  this->sleep_command = pSVar2;
  pOVar3 = (OpenDataServerCommand *)operator_new(0x40);
  (pOVar3->super_Command)._vptr_Command = (_func_int **)0x0;
  *(undefined8 *)&pOVar3->port = 0;
  (pOVar3->port_string)._M_dataplus._M_p = (pointer)0x0;
  (pOVar3->port_string)._M_string_length = 0;
  (pOVar3->port_string).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pOVar3->port_string).field_2 + 8) = 0;
  *(undefined8 *)&pOVar3->client_socket = 0;
  pOVar3->client_socket_pointer = (int *)0x0;
  (pOVar3->super_Command)._vptr_Command = (_func_int **)&PTR_execute_001167f0;
  (pOVar3->port_string)._M_dataplus._M_p = (pointer)&(pOVar3->port_string).field_2;
  (pOVar3->port_string)._M_string_length = 0;
  (pOVar3->port_string).field_2._M_local_buf[0] = '\0';
  this->open_data_server_command = pOVar3;
  this_00 = (ConnectCommand *)operator_new(0x30);
  ConnectCommand::ConnectCommand(this_00);
  this->connect_command = this_00;
  this_01 = (AssignVarCommand *)operator_new(0x28);
  AssignVarCommand::AssignVarCommand(this_01);
  this->assign_var_command = this_01;
  pDVar4 = (DefineVarCommand *)operator_new(0x20);
  (pDVar4->super_Command)._vptr_Command = (_func_int **)&PTR_execute_00116a38;
  (pDVar4->type_data).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pDVar4->type_data).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pDVar4->type_data).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->define_var_command = pDVar4;
  return;
}

Assistant:

Interpreter::Interpreter(vector<vector<string>> lexed_data) {
  this->lexed_data_to_interpret = lexed_data;
  this->print_command = new PrintCommand();
  this->sleep_command = new SleepCommand();
  this->open_data_server_command = new OpenDataServerCommand();
  this->connect_command = new ConnectCommand();
  this->assign_var_command = new AssignVarCommand();
  this->define_var_command = new DefineVarCommand();
}